

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O3

void __thiscall
llama_sbatch::add_seq_to_ubatch
          (llama_sbatch *this,llama_ubatch *ubatch,llama_sbatch_seq *seq,size_t length)

{
  char cVar1;
  llama_batch *plVar2;
  llama_token *plVar3;
  pointer plVar4;
  llama_token *plVar5;
  llama_pos *plVar6;
  llama_pos *plVar7;
  iterator iVar8;
  int8_t *piVar9;
  byte bVar10;
  uint32_t uVar11;
  float *pfVar12;
  char *pcVar13;
  uint32_t uVar14;
  int32_t *piVar15;
  uint32_t uVar16;
  long lVar17;
  uint32_t uVar18;
  undefined8 uVar19;
  size_t sVar20;
  size_t sVar21;
  bool bVar22;
  long local_38;
  
  plVar2 = this->batch;
  if (plVar2 == (llama_batch *)0x0) {
    pcVar13 = "batch != nullptr";
    uVar19 = 0x27;
    goto LAB_00187139;
  }
  if (seq->length < length) {
    pcVar13 = "length <= seq.length";
    uVar19 = 0x28;
    goto LAB_00187139;
  }
  if (((seq->n_seq_id != 0) && (ubatch->n_seqs != 0)) &&
     ((ulong)ubatch->n_tokens / (ulong)ubatch->n_seqs != length)) {
    pcVar13 = 
    "seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs";
    uVar19 = 0x2b;
    goto LAB_00187139;
  }
  bVar10 = ubatch->equal_seqs;
  if ((bool)bVar10 != (seq->n_seq_id != 0)) {
    pcVar13 = "(seq.n_seq_id != 0) == ubatch.equal_seqs";
    uVar19 = 0x2c;
    goto LAB_00187139;
  }
  plVar3 = plVar2->token;
  if (plVar3 == (llama_token *)0x0) {
    ubatch->token = (llama_token *)0x0;
LAB_00186ceb:
    pfVar12 = plVar2->embd;
    if (pfVar12 == (float *)0x0) {
LAB_00186d90:
      ubatch->embd = (float *)0x0;
    }
    else if ((bool)bVar10 == false) {
      sVar21 = seq->offset;
LAB_00186d79:
      ubatch->embd = pfVar12 + sVar21 * this->n_embd;
    }
    else if (length != 0) {
      sVar21 = 0;
      do {
        sVar20 = this->n_embd;
        memcpy(ubatch->embd + (ubatch->n_tokens + sVar21) * sVar20,
               this->batch->embd +
               (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start[seq->offset + sVar21] * sVar20,sVar20 << 2);
        sVar21 = sVar21 + 1;
      } while (length != sVar21);
      bVar10 = ubatch->equal_seqs;
    }
  }
  else {
    if ((bool)bVar10 == false) {
      sVar21 = seq->offset;
      ubatch->token = plVar3 + sVar21;
      pfVar12 = plVar2->embd;
      if (pfVar12 != (float *)0x0) goto LAB_00186d79;
      goto LAB_00186d90;
    }
    if (length != 0) {
      sVar21 = seq->offset;
      plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar5 = ubatch->token;
      sVar20 = 0;
      do {
        plVar5[ubatch->n_tokens + sVar20] = plVar3[plVar4[sVar21 + sVar20]];
        sVar20 = sVar20 + 1;
      } while (length != sVar20);
      goto LAB_00186ceb;
    }
    if (plVar2->embd == (float *)0x0) goto LAB_00186d90;
  }
  if ((bVar10 & 1) == 0) {
    plVar2 = this->batch;
    ubatch->pos = plVar2->pos + seq->offset;
    if (plVar2->n_seq_id == (int32_t *)0x0) {
      if (length != 0) {
        piVar15 = ubatch->n_seq_id;
        sVar21 = length;
        do {
          piVar15[ubatch->n_seqs] = 1;
          piVar15 = piVar15 + 1;
          sVar21 = sVar21 - 1;
        } while (sVar21 != 0);
      }
    }
    else {
      ubatch->n_seq_id = plVar2->n_seq_id + seq->offset;
    }
    if (plVar2->seq_id != (llama_seq_id **)0x0) {
      ubatch->seq_id = plVar2->seq_id + seq->offset;
    }
  }
  else {
    if (length != 0) {
      plVar6 = this->batch->pos;
      sVar21 = seq->offset;
      plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar7 = ubatch->pos;
      sVar20 = 0;
      do {
        plVar7[ubatch->n_tokens + sVar20] = plVar6[plVar4[sVar21 + sVar20]];
        sVar20 = sVar20 + 1;
      } while (length != sVar20);
    }
    ubatch->n_seq_id[ubatch->n_seqs] = seq->n_seq_id;
    if (seq->seq_id != (llama_seq_id *)0x0) {
      ubatch->seq_id[ubatch->n_seqs] = seq->seq_id;
    }
  }
  if (this->logits_all == true) {
    if (length != 0) {
      lVar17 = 0;
      sVar21 = 0;
      do {
        ubatch->output[sVar21 + ubatch->n_tokens] = '\x01';
        plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8._M_current =
             (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&this->out_ids,iVar8,
                     (long *)((long)plVar4 + lVar17 + seq->offset * 8));
        }
        else {
          *iVar8._M_current = plVar4[seq->offset + sVar21];
          (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar8._M_current + 1;
        }
        sVar21 = sVar21 + 1;
        lVar17 = lVar17 + 8;
      } while (length != sVar21);
    }
  }
  else {
    piVar9 = this->batch->logits;
    if (piVar9 == (int8_t *)0x0) {
      if (length != 0) {
        sVar21 = 0;
        do {
          plVar4 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar17 = plVar4[seq->offset + sVar21];
          bVar22 = lVar17 == ((long)(this->ids).super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >> 3) +
                             -1;
          ubatch->output[sVar21 + ubatch->n_tokens] = bVar22;
          if (bVar22) {
            iVar8._M_current =
                 (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_38 = lVar17;
            if (iVar8._M_current ==
                (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&this->out_ids,iVar8,&local_38);
            }
            else {
              *iVar8._M_current = lVar17;
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
          sVar21 = sVar21 + 1;
        } while (length != sVar21);
      }
    }
    else if ((bVar10 & 1) == 0) {
      ubatch->output = piVar9 + seq->offset;
      if (length != 0) {
        sVar21 = 0;
        do {
          if (ubatch->output[sVar21] != '\0') {
            local_38 = seq->offset + sVar21;
            iVar8._M_current =
                 (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                        (&this->out_ids,iVar8,&local_38);
            }
            else {
              *iVar8._M_current = local_38;
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
          }
          sVar21 = sVar21 + 1;
        } while (length != sVar21);
      }
    }
    else if (length != 0) {
      sVar21 = 0;
      do {
        lVar17 = (this->ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start[seq->offset + sVar21];
        cVar1 = this->batch->logits[lVar17];
        ubatch->output[sVar21 + ubatch->n_tokens] = cVar1;
        if (cVar1 != '\0') {
          iVar8._M_current =
               (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_38 = lVar17;
          if (iVar8._M_current ==
              (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                      (&this->out_ids,iVar8,&local_38);
          }
          else {
            *iVar8._M_current = lVar17;
            (this->out_ids).super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
        }
        sVar21 = sVar21 + 1;
      } while (length != sVar21);
    }
  }
  uVar16 = (uint32_t)length;
  if (ubatch->n_tokens == 0 && ubatch->n_seqs == 0) {
    uVar14 = 1;
    if ((ubatch->equal_seqs & 1U) != 0) {
      uVar14 = uVar16;
    }
    ubatch->n_seq_tokens = uVar14;
  }
  else {
    uVar14 = ubatch->n_seq_tokens;
  }
  uVar11 = ubatch->n_tokens + uVar16;
  ubatch->n_tokens = uVar11;
  uVar18 = 1;
  if ((ubatch->equal_seqs & 1U) == 0) {
    uVar18 = uVar16;
  }
  uVar18 = uVar18 + ubatch->n_seqs;
  ubatch->n_seqs = uVar18;
  seq->offset = seq->offset + length;
  seq->length = seq->length - length;
  this->n_tokens = this->n_tokens - length;
  if (uVar11 == uVar18 * uVar14) {
    return;
  }
  pcVar13 = "ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs";
  uVar19 = 0x89;
LAB_00187139:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-batch.cpp"
             ,uVar19,"GGML_ASSERT(%s) failed",pcVar13);
}

Assistant:

void llama_sbatch::add_seq_to_ubatch(llama_ubatch & ubatch, llama_sbatch_seq & seq, size_t length) {
    GGML_ASSERT(batch != nullptr);
    GGML_ASSERT(length <= seq.length);
    // Can only add sequences of equal lengths to a batch,
    // otherwise it isn't clear to which sequence a token belongs
    GGML_ASSERT(seq.n_seq_id == 0 || ubatch.n_seqs == 0 || length == (size_t) ubatch.n_tokens / ubatch.n_seqs);
    GGML_ASSERT((seq.n_seq_id != 0) == ubatch.equal_seqs);
    // NOTE: loops are separated for cache-friendliness
    if (batch->token) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                ubatch.token[ubatch.n_tokens + i] = batch->token[ids[seq.offset + i]];
            }
        } else {
            // simple split
            ubatch.token = batch->token + seq.offset;
        }
    } else {
        ubatch.token = nullptr;
    }
    if (batch->embd) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                memcpy(
                        ubatch.embd + (n_embd * (ubatch.n_tokens + i)),
                        batch->embd + (n_embd * ids[seq.offset + i]),
                        n_embd * sizeof(float)
                      );
            }
        } else {
            // simple split
            ubatch.embd = batch->embd + (n_embd * seq.offset);
        }
    } else {
        ubatch.embd = nullptr;
    }
    if (ubatch.equal_seqs) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.pos[ubatch.n_tokens + i] = batch->pos[ids[seq.offset + i]];
        }
    } else {
        // simple split
        ubatch.pos = batch->pos + seq.offset;
    }
    if (ubatch.equal_seqs) {
        ubatch.n_seq_id[ubatch.n_seqs] = seq.n_seq_id;
        if (seq.seq_id) {
            ubatch.seq_id[ubatch.n_seqs] = seq.seq_id;
        }
    } else {
        // simple split
        if (batch->n_seq_id) {
            ubatch.n_seq_id = batch->n_seq_id + seq.offset;
        } else {
            for (size_t i = 0; i < length; ++i) {
                ubatch.n_seq_id[ubatch.n_seqs + i] = 1;
            }
        }
        if (batch->seq_id) {
            ubatch.seq_id = batch->seq_id + seq.offset;
        }
    }
    if (logits_all) {
        for (size_t i = 0; i < length; ++i) {
            ubatch.output[ubatch.n_tokens + i] = 1;
            out_ids.push_back(ids[seq.offset + i]);
        }
    } else if (batch->logits) {
        if (ubatch.equal_seqs) {
            for (size_t i = 0; i < length; ++i) {
                size_t id = ids[seq.offset + i];
                int8_t is_output = batch->logits[id];
                ubatch.output[ubatch.n_tokens + i] = is_output;
                if (is_output) { out_ids.push_back(id); }
            }
        } else {
            // simple split
            ubatch.output = batch->logits + seq.offset;
            for (size_t i = 0; i < length; ++i) {
                if (ubatch.output[i] != 0) { out_ids.push_back(seq.offset + i); }
            }
        }
    } else {
        // only get last output
        for (size_t i = 0; i < length; ++i) {
            size_t id = ids[seq.offset + i];
            int8_t is_last = id == ids.size() - 1;
            ubatch.output[ubatch.n_tokens + i] = is_last;
            if (is_last) { out_ids.push_back(id); }
        }
    }
    if (ubatch.n_tokens == 0 && ubatch.n_seqs == 0) {
        ubatch.n_seq_tokens = ubatch.equal_seqs ? length : 1;
    }
    ubatch.n_tokens += length;
    ubatch.n_seqs += ubatch.equal_seqs ? 1 : length; // virtual sequences for simple splits
    seq.offset += length;
    seq.length -= length;
    n_tokens -= length;
    GGML_ASSERT(ubatch.n_tokens == ubatch.n_seq_tokens * ubatch.n_seqs);
}